

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O3

bool __thiscall
sptk::StatisticsAccumulation::GetDiagonalCovariance
          (StatisticsAccumulation *this,Buffer *buffer,
          vector<double,_std::allocator<double>_> *diagonal_covariance)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  size_type __new_size;
  long lVar5;
  pointer pdVar6;
  vector<double,_std::allocator<double>_> mean;
  undefined1 local_68 [32];
  Row local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (1 < this->num_statistics_order_) {
    iVar3 = buffer->zeroth_order_statistics_;
    if (diagonal_covariance != (vector<double,_std::allocator<double>_> *)0x0 && 0 < iVar3) {
      pdVar6 = (diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __new_size = (long)this->num_order_ + 1;
      if ((long)(diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar6 >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(diagonal_covariance,__new_size);
        iVar3 = buffer->zeroth_order_statistics_;
        pdVar6 = (diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (this->numerically_stable_ == true) {
        if (this->num_order_ < 0) {
          return true;
        }
        lVar5 = 0;
        do {
          local_68._0_8_ = &PTR__Row_00111d20;
          local_68._16_4_ = (int)lVar5;
          local_68._8_8_ = &buffer->second_order_statistics_;
          pdVar4 = SymmetricMatrix::Row::operator[]((Row *)local_68,(int)lVar5);
          pdVar6[lVar5] = *pdVar4 * (1.0 / (double)iVar3);
          bVar2 = lVar5 < this->num_order_;
          lVar5 = lVar5 + 1;
        } while (bVar2);
        return true;
      }
      local_68._0_8_ = (_func_int **)0x0;
      local_68._8_8_ = (SymmetricMatrix *)0x0;
      local_68._16_8_ = (pointer)0x0;
      bVar2 = GetMean(this,buffer,(vector<double,_std::allocator<double>_> *)local_68);
      uVar1 = local_68._0_8_;
      if (bVar2) {
        if (-1 < this->num_order_) {
          lVar5 = 0;
          do {
            local_48._vptr_Row = (_func_int **)&PTR__Row_00111d20;
            local_48.row_ = (int)lVar5;
            local_48.matrix_ = &buffer->second_order_statistics_;
            pdVar4 = SymmetricMatrix::Row::operator[](&local_48,local_48.row_);
            pdVar6[lVar5] =
                 *pdVar4 * (1.0 / (double)iVar3) -
                 (double)*(_func_int **)(uVar1 + lVar5 * 8) *
                 (double)*(_func_int **)(uVar1 + lVar5 * 8);
            bVar2 = lVar5 < this->num_order_;
            lVar5 = lVar5 + 1;
          } while (bVar2);
        }
        if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_68._0_8_);
        }
        return true;
      }
      if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_68._0_8_);
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool StatisticsAccumulation::GetDiagonalCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* diagonal_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == diagonal_covariance) {
    return false;
  }

  if (diagonal_covariance->size() != static_cast<std::size_t>(num_order_ + 1)) {
    diagonal_covariance->resize(num_order_ + 1);
  }

  const double z(1.0 / buffer.zeroth_order_statistics_);
  double* variance(&((*diagonal_covariance)[0]));

  if (numerically_stable_) {
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i];
    }
  } else {
    std::vector<double> mean;
    if (!GetMean(buffer, &mean)) {
      return false;
    }
    const double* mu(&(mean[0]));
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i] - mu[i] * mu[i];
    }
  }

  return true;
}